

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_linearization.cc
# Opt level: O2

void __thiscall
QPDF::generateHintStream
          (QPDF *this,NewObjTable *new_obj,ObjTable *obj,string *hint_buffer,int *S,int *O,
          bool compressed)

{
  int iVar1;
  size_type *psVar2;
  QPDF *this_00;
  BitWriter w;
  string b;
  _Head_base<0UL,_qpdf::pl::Count_*,_false> local_90;
  undefined1 local_88 [16];
  BitWriter local_78;
  int *local_60;
  undefined1 local_58 [8];
  __uniq_ptr_impl<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  local_60 = S;
  calculateHPageOffset(this,new_obj,obj);
  calculateHSharedObject(this,new_obj,obj);
  calculateHOutline(this,new_obj,obj);
  local_50._M_t.super__Tuple_impl<0UL,_qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>.
  super__Head_base<0UL,_qpdf::pl::Link_*,_false>._M_head_impl =
       (tuple<qpdf::pl::Link_*,_std::default_delete<qpdf::pl::Link>_>)(local_48._M_local_buf + 8);
  local_48._M_allocated_capacity = 0;
  local_48._M_local_buf[8] = '\0';
  if (compressed) {
    local_88._0_8_ = local_88._0_8_ & 0xffffffff00000000;
    ::qpdf::pl::create<qpdf::pl::String,std::__cxx11::string&>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_88 + 8));
    local_58._4_4_ = 1;
    ::qpdf::pl::create<Pl_Flate,Pl_Flate::action_e>
              ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_78,
               (action_e *)(local_88 + 8));
    std::
    make_unique<qpdf::pl::Count,int,std::__cxx11::string&,std::unique_ptr<qpdf::pl::Link,std::default_delete<qpdf::pl::Link>>>
              ((int *)&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88,
               (unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_50);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
              ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)&local_78);
    std::unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_>::~unique_ptr
              ((unique_ptr<qpdf::pl::Link,_std::default_delete<qpdf::pl::Link>_> *)(local_88 + 8));
  }
  else {
    local_58._0_4_ = 0;
    std::make_unique<qpdf::pl::Count,int,std::__cxx11::string&>
              ((int *)&local_90,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_58);
  }
  BitWriter::BitWriter(&local_78,&(local_90._M_head_impl)->super_Pipeline);
  writeHPageOffset(this,&local_78);
  psVar2 = (size_type *)&(local_90._M_head_impl)->count;
  if ((local_90._M_head_impl)->str != (string *)0x0) {
    psVar2 = &(local_90._M_head_impl)->str->_M_string_length;
  }
  local_88._0_8_ = *psVar2;
  iVar1 = QIntC::IntConverter<long_long,_int,_true,_true>::convert((longlong *)local_88);
  *local_60 = iVar1;
  writeHSharedObject(this,&local_78);
  *O = 0;
  if (0 < *(int *)((long)&((this->m)._M_t.
                           super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>
                           .super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->
                          outline_hints + 0x10)) {
    psVar2 = (size_type *)&(local_90._M_head_impl)->count;
    if ((local_90._M_head_impl)->str != (string *)0x0) {
      psVar2 = &(local_90._M_head_impl)->str->_M_string_length;
    }
    local_88._0_8_ = *psVar2;
    this_00 = (QPDF *)local_88;
    iVar1 = QIntC::IntConverter<long_long,_int,_true,_true>::convert((longlong *)this_00);
    *O = iVar1;
    writeHGeneric(this_00,&local_78,
                  &((this->m)._M_t.
                    super___uniq_ptr_impl<QPDF::Members,_std::default_delete<QPDF::Members>_>._M_t.
                    super__Tuple_impl<0UL,_QPDF::Members_*,_std::default_delete<QPDF::Members>_>.
                    super__Head_base<0UL,_QPDF::Members_*,_false>._M_head_impl)->outline_hints);
  }
  ::qpdf::pl::Count::finish(local_90._M_head_impl);
  std::unique_ptr<qpdf::pl::Count,_std::default_delete<qpdf::pl::Count>_>::~unique_ptr
            ((unique_ptr<qpdf::pl::Count,_std::default_delete<qpdf::pl::Count>_> *)&local_90);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void
QPDF::generateHintStream(
    QPDFWriter::NewObjTable const& new_obj,
    QPDFWriter::ObjTable const& obj,
    std::string& hint_buffer,
    int& S,
    int& O,
    bool compressed)
{
    // Populate actual hint table values
    calculateHPageOffset(new_obj, obj);
    calculateHSharedObject(new_obj, obj);
    calculateHOutline(new_obj, obj);

    // Write the hint stream itself into a compressed memory buffer. Write through a counter so we
    // can get offsets.
    std::string b;
    auto c = compressed
        ? std::make_unique<pl::Count>(
              0, b, pl::create<Pl_Flate>(pl::create<pl::String>(hint_buffer), Pl_Flate::a_deflate))
        : std::make_unique<pl::Count>(0, hint_buffer);

    BitWriter w(c.get());

    writeHPageOffset(w);
    S = toI(c->getCount());
    writeHSharedObject(w);
    O = 0;
    if (m->outline_hints.nobjects > 0) {
        O = toI(c->getCount());
        writeHGeneric(w, m->outline_hints);
    }
    c->finish();
}